

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O0

void __thiscall OpenMD::SC::addType(SC *this,AtomType *atomType)

{
  _Rb_tree_color _Var1;
  bool bVar2;
  size_type sVar3;
  _Rb_tree_color *p_Var4;
  reference __dest;
  AtomType *atomType1;
  reference piVar5;
  value_type_conflict *pvVar6;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar7;
  reference pvVar8;
  reference pvVar9;
  AtomType *in_RSI;
  long in_RDI;
  ForceField *this_00;
  double dVar10;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar11;
  CubicSpline *phi;
  CubicSpline *V;
  RealType r;
  int k;
  vector<double,_std::allocator<double>_> phivals;
  vector<double,_std::allocator<double>_> vvals;
  vector<double,_std::allocator<double>_> rvals;
  RealType dr;
  SCInteractionData mixer;
  AtomType *atype2;
  int sctid2;
  iterator it;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int sctid;
  int atid;
  SCAtomData scAtomData;
  SuttonChenAdapter sca;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffe08;
  AtomType *in_stack_fffffffffffffe10;
  value_type_conflict *in_stack_fffffffffffffe18;
  AtomType *in_stack_fffffffffffffe20;
  value_type_conflict2 *in_stack_fffffffffffffe28;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffe30;
  SC *this_01;
  vector<double,_std::allocator<double>_> *xps;
  CubicSpline *this_02;
  int local_16c;
  AtomType *in_stack_fffffffffffffe98;
  AtomType *in_stack_fffffffffffffea0;
  SC *in_stack_fffffffffffffea8;
  undefined1 local_110 [32];
  RealType local_f0;
  AtomType *local_e8;
  pointer local_e0;
  pointer local_d8;
  pointer local_d0;
  pointer local_c8;
  value_type_conflict *local_c0;
  set<int,_std::less<int>,_std::allocator<int>_> *local_b8;
  undefined1 local_b0;
  AtomType *local_a8;
  _Rb_tree_color local_9c;
  _Self local_98;
  _Base_ptr local_90;
  undefined1 local_88 [16];
  undefined1 local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_70;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_60;
  _Rb_tree_color local_50;
  uint local_4c;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  double local_30;
  pointer local_28;
  pointer local_20;
  SuttonChenAdapter local_18;
  AtomType *local_10;
  
  local_10 = in_RSI;
  SuttonChenAdapter::SuttonChenAdapter(&local_18,in_RSI);
  local_48 = (_Base_ptr)SuttonChenAdapter::getC((SuttonChenAdapter *)in_stack_fffffffffffffe30);
  local_40 = (_Base_ptr)SuttonChenAdapter::getM((SuttonChenAdapter *)in_stack_fffffffffffffe30);
  local_38 = (_Base_ptr)SuttonChenAdapter::getN((SuttonChenAdapter *)in_stack_fffffffffffffe30);
  local_30 = SuttonChenAdapter::getAlpha((SuttonChenAdapter *)in_stack_fffffffffffffe30);
  local_28 = (pointer)SuttonChenAdapter::getEpsilon((SuttonChenAdapter *)in_stack_fffffffffffffe30);
  local_20 = (pointer)(local_30 + local_30);
  local_4c = AtomType::getIdent(local_10);
  this_00 = (ForceField *)(in_RDI + 0x30);
  sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3161aa);
  local_50 = (_Rb_tree_color)sVar3;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>
            ((pair<std::_Rb_tree_const_iterator<int>,_bool> *)in_stack_fffffffffffffe10);
  pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_88._8_8_ = pVar11.first._M_node;
  local_78 = pVar11.second;
  local_70._M_allocated_capacity = local_88._8_8_;
  local_70._M_local_buf[8] = local_78;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_60,(type)&local_70);
  if ((local_60.second & 1U) == 0) {
    snprintf(painCave.errMsg,2000,"SC already had a previous entry with ident %d\n",(ulong)local_4c)
    ;
    painCave.severity = 3;
    painCave.isFatal = 0;
    simError();
  }
  _Var1 = local_50;
  p_Var4 = (_Rb_tree_color *)
           std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)(int)local_4c);
  *p_Var4 = _Var1;
  __dest = std::vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>::operator[]
                     ((vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_> *)
                      (in_RDI + 0x78),(long)(int)local_50);
  memcpy(__dest,&local_48,0x30);
  std::
  vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                *)(in_RDI + 0x90),(long)(int)local_50);
  std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>::resize
            ((vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_> *)
             in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<int> *)local_88);
  local_90 = (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_fffffffffffffe08);
  local_88._0_8_ = local_90;
  while( true ) {
    local_98._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_fffffffffffffe08);
    bVar2 = std::operator!=((_Self *)local_88,&local_98);
    if (!bVar2) break;
    atomType1 = (AtomType *)(in_RDI + 0x60);
    this_01 = (SC *)local_88;
    piVar5 = std::_Rb_tree_const_iterator<int>::operator*
                       ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffe10);
    p_Var4 = (_Rb_tree_color *)
             std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)atomType1,(long)*piVar5);
    local_9c = *p_Var4;
    xps = *(vector<double,_std::allocator<double>_> **)(in_RDI + 0xb0);
    std::_Rb_tree_const_iterator<int>::operator*
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffe10);
    local_a8 = ForceField::getAtomType(this_00,(int)((ulong)in_RDI >> 0x20));
    local_f0 = getAlpha(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                        in_stack_fffffffffffffe98);
    local_d0 = (pointer)(local_f0 + local_f0);
    local_e8 = (AtomType *)getEpsilon(this_01,atomType1,in_stack_fffffffffffffe20);
    local_e0 = (pointer)getM(this_01,atomType1,in_stack_fffffffffffffe20);
    local_d8 = (pointer)getN(this_01,atomType1,in_stack_fffffffffffffe20);
    local_110._24_8_ = (double)local_d0 / (double)(*(int *)(in_RDI + 0xe8) + -1);
    this_02 = (CubicSpline *)local_110;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x316494);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3164a1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3164ae);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe10,
               (value_type_conflict *)in_stack_fffffffffffffe08);
    in_stack_fffffffffffffea0 = (AtomType *)0x0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe10,
               (value_type_conflict *)in_stack_fffffffffffffe08);
    in_stack_fffffffffffffe98 = (AtomType *)0x0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe10,
               (value_type_conflict *)in_stack_fffffffffffffe08);
    for (local_16c = 1; local_16c < *(int *)(in_RDI + 0xe8); local_16c = local_16c + 1) {
      dVar10 = (double)local_110._24_8_ * (double)local_16c;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20,
                 in_stack_fffffffffffffe18);
      in_stack_fffffffffffffe20 = local_e8;
      pow(local_f0 / dVar10,(double)local_d8);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe10,
                 (value_type_conflict *)in_stack_fffffffffffffe08);
      pow(local_f0 / dVar10,(double)local_e0);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe10,
                 (value_type_conflict *)in_stack_fffffffffffffe08);
    }
    in_stack_fffffffffffffe10 = local_e8;
    dVar10 = pow(local_f0 / (double)local_d0,(double)local_d8);
    local_c8 = (pointer)((double)in_stack_fffffffffffffe10 * dVar10);
    pvVar6 = (value_type_conflict *)operator_new(0xa0);
    CubicSpline::CubicSpline((CubicSpline *)in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe18 = pvVar6;
    CubicSpline::addPoints(this_02,xps,(vector<double,_std::allocator<double>_> *)this_01);
    psVar7 = (set<int,_std::less<int>,_std::allocator<int>_> *)operator_new(0xa0);
    CubicSpline::CubicSpline((CubicSpline *)in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe08 = psVar7;
    CubicSpline::addPoints(this_02,xps,(vector<double,_std::allocator<double>_> *)this_01);
    local_b0 = 0;
    local_c0 = pvVar6;
    local_b8 = psVar7;
    std::
    vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
    ::operator[]((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                  *)(in_RDI + 0x90),(long)(int)local_9c);
    std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>::resize
              ((vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_> *)
               this_01,(size_type)atomType1);
    pvVar8 = std::
             vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                           *)(in_RDI + 0x90),(long)(int)local_50);
    pvVar9 = std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>::
             operator[](pvVar8,(long)(int)local_9c);
    memcpy(pvVar9,&local_f0,0x48);
    if (local_9c != local_50) {
      pvVar8 = std::
               vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
               ::operator[]((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                             *)(in_RDI + 0x90),(long)(int)local_9c);
      pvVar9 = std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>::
               operator[](pvVar8,(long)(int)local_50);
      memcpy(pvVar9,&local_f0,0x48);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20);
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffe10);
  }
  return;
}

Assistant:

void SC::addType(AtomType* atomType) {
    SuttonChenAdapter sca = SuttonChenAdapter(atomType);
    SCAtomData scAtomData;

    scAtomData.c       = sca.getC();
    scAtomData.m       = sca.getM();
    scAtomData.n       = sca.getN();
    scAtomData.alpha   = sca.getAlpha();
    scAtomData.epsilon = sca.getEpsilon();
    scAtomData.rCut    = 2.0 * scAtomData.alpha;

    // add it to the map:
    int atid  = atomType->getIdent();
    int sctid = SCtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = SCtypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SC already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    SCtids[atid]  = sctid;
    SCdata[sctid] = scAtomData;
    MixingMap[sctid].resize(nSC_);

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = SCtypes.begin(); it != SCtypes.end(); ++it) {
      int sctid2       = SCtids[(*it)];
      AtomType* atype2 = forceField_->getAtomType((*it));

      SCInteractionData mixer;

      mixer.alpha   = getAlpha(atomType, atype2);
      mixer.rCut    = 2.0 * mixer.alpha;
      mixer.epsilon = getEpsilon(atomType, atype2);
      mixer.m       = getM(atomType, atype2);
      mixer.n       = getN(atomType, atype2);

      RealType dr = mixer.rCut / (np_ - 1);
      vector<RealType> rvals;
      vector<RealType> vvals;
      vector<RealType> phivals;

      rvals.push_back(0.0);
      vvals.push_back(0.0);
      phivals.push_back(0.0);

      for (int k = 1; k < np_; k++) {
        RealType r = dr * k;
        rvals.push_back(r);
        vvals.push_back(mixer.epsilon * pow(mixer.alpha / r, mixer.n));
        phivals.push_back(pow(mixer.alpha / r, mixer.m));
      }

      mixer.vCut = mixer.epsilon * pow(mixer.alpha / mixer.rCut, mixer.n);

      CubicSpline* V = new CubicSpline();
      V->addPoints(rvals, vvals);

      CubicSpline* phi = new CubicSpline();
      phi->addPoints(rvals, phivals);

      mixer.V   = V;
      mixer.phi = phi;

      mixer.explicitlySet = false;

      MixingMap[sctid2].resize(nSC_);

      MixingMap[sctid][sctid2] = mixer;
      if (sctid2 != sctid) { MixingMap[sctid2][sctid] = mixer; }
    }
    return;
  }